

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O1

void __thiscall cbtMatrix3x3::getRotation(cbtMatrix3x3 *this,cbtQuaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  int iVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  cbtScalar temp [4];
  float local_48 [4];
  cbtQuaternion *local_38;
  ulong uVar7;
  
  fVar11 = this->m_el[0].m_floats[0];
  fVar1 = this->m_el[1].m_floats[1];
  fVar2 = this->m_el[2].m_floats[2];
  fVar3 = fVar11 + fVar1 + fVar2;
  if (fVar3 <= 0.0) {
    uVar5 = (uint)(fVar11 < fVar2) * 2;
    if (fVar11 < fVar1) {
      uVar5 = (fVar1 < fVar2) + 1;
    }
    iVar8 = 0;
    if (uVar5 + 1 != 3) {
      iVar8 = uVar5 + 1;
    }
    uVar6 = uVar5 + 2 + ((uVar5 + 2) / 3) * -3;
    uVar7 = (ulong)uVar6;
    uVar10 = (ulong)uVar5;
    lVar9 = (long)iVar8;
    fVar11 = ((*(float *)((long)this->m_el + uVar10 * 0x14) -
              *(float *)((long)this->m_el + lVar9 * 0x14)) -
             *(float *)((long)this->m_el[0].m_floats + uVar7 * 4 + (ulong)(uVar6 * 0x10))) + 1.0;
    if (fVar11 < 0.0) {
      local_38 = q;
      fVar11 = sqrtf(fVar11);
      q = local_38;
    }
    else {
      auVar4 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
      fVar11 = auVar4._0_4_;
    }
    local_48[uVar10] = fVar11 * 0.5;
    fVar11 = 0.5 / fVar11;
    local_48[3] = fVar11 * (*(float *)((long)this->m_el[0].m_floats +
                                      lVar9 * 4 + (ulong)(uVar6 * 0x10)) -
                           this->m_el[lVar9].m_floats[uVar7]);
    local_48[lVar9] =
         fVar11 * (this->m_el[lVar9].m_floats[uVar10] + this->m_el[uVar10].m_floats[lVar9]);
    local_48[uVar7] =
         fVar11 * (*(float *)((long)this->m_el[0].m_floats + uVar10 * 4 + (ulong)(uVar6 * 0x10)) +
                  this->m_el[uVar10].m_floats[uVar7]);
  }
  else {
    fVar3 = fVar3 + 1.0;
    if (fVar3 < 0.0) {
      fVar11 = sqrtf(fVar3);
    }
    else {
      auVar4 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
      fVar11 = auVar4._0_4_;
    }
    local_48[3] = fVar11 * 0.5;
    fVar11 = 0.5 / fVar11;
    local_48[0] = fVar11 * (this->m_el[2].m_floats[1] - this->m_el[1].m_floats[2]);
    local_48[1] = fVar11 * (this->m_el[0].m_floats[2] - this->m_el[2].m_floats[0]);
    local_48[2] = fVar11 * (this->m_el[1].m_floats[0] - this->m_el[0].m_floats[1]);
  }
  (q->super_cbtQuadWord).m_floats[0] = local_48[0];
  (q->super_cbtQuadWord).m_floats[1] = local_48[1];
  (q->super_cbtQuadWord).m_floats[2] = local_48[2];
  (q->super_cbtQuadWord).m_floats[3] = local_48[3];
  return;
}

Assistant:

void getRotation(cbtQuaternion & q) const
	{
#if (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)) || defined(BT_USE_NEON)
		cbtScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();
		cbtScalar s, x;

		union {
			cbtSimdFloat4 vec;
			cbtScalar f[4];
		} temp;

		if (trace > cbtScalar(0.0))
		{
			x = trace + cbtScalar(1.0);

			temp.f[0] = m_el[2].y() - m_el[1].z();
			temp.f[1] = m_el[0].z() - m_el[2].x();
			temp.f[2] = m_el[1].x() - m_el[0].y();
			temp.f[3] = x;
			//temp.f[3]= s * cbtScalar(0.5);
		}
		else
		{
			int i, j, k;
			if (m_el[0].x() < m_el[1].y())
			{
				if (m_el[1].y() < m_el[2].z())
				{
					i = 2;
					j = 0;
					k = 1;
				}
				else
				{
					i = 1;
					j = 2;
					k = 0;
				}
			}
			else
			{
				if (m_el[0].x() < m_el[2].z())
				{
					i = 2;
					j = 0;
					k = 1;
				}
				else
				{
					i = 0;
					j = 1;
					k = 2;
				}
			}

			x = m_el[i][i] - m_el[j][j] - m_el[k][k] + cbtScalar(1.0);

			temp.f[3] = (m_el[k][j] - m_el[j][k]);
			temp.f[j] = (m_el[j][i] + m_el[i][j]);
			temp.f[k] = (m_el[k][i] + m_el[i][k]);
			temp.f[i] = x;
			//temp.f[i] = s * cbtScalar(0.5);
		}

		s = cbtSqrt(x);
		q.set128(temp.vec);
		s = cbtScalar(0.5) / s;

		q *= s;
#else
		cbtScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();

		cbtScalar temp[4];

		if (trace > cbtScalar(0.0))
		{
			cbtScalar s = cbtSqrt(trace + cbtScalar(1.0));
			temp[3] = (s * cbtScalar(0.5));
			s = cbtScalar(0.5) / s;

			temp[0] = ((m_el[2].y() - m_el[1].z()) * s);
			temp[1] = ((m_el[0].z() - m_el[2].x()) * s);
			temp[2] = ((m_el[1].x() - m_el[0].y()) * s);
		}
		else
		{
			int i = m_el[0].x() < m_el[1].y() ? (m_el[1].y() < m_el[2].z() ? 2 : 1) : (m_el[0].x() < m_el[2].z() ? 2 : 0);
			int j = (i + 1) % 3;
			int k = (i + 2) % 3;

			cbtScalar s = cbtSqrt(m_el[i][i] - m_el[j][j] - m_el[k][k] + cbtScalar(1.0));
			temp[i] = s * cbtScalar(0.5);
			s = cbtScalar(0.5) / s;

			temp[3] = (m_el[k][j] - m_el[j][k]) * s;
			temp[j] = (m_el[j][i] + m_el[i][j]) * s;
			temp[k] = (m_el[k][i] + m_el[i][k]) * s;
		}
		q.setValue(temp[0], temp[1], temp[2], temp[3]);
#endif
	}